

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCropLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  mapped_type *pmVar5;
  CropLayerParams *pCVar6;
  BorderAmounts *pBVar7;
  bool local_2c2;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [8];
  string err_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150 [8];
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string err;
  _Self local_a8;
  _Self local_a0;
  _Self local_98;
  allocator<char> local_89;
  string local_88;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar2;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 == 0) {
    local_39 = 0;
    validateOutputCount(__return_storage_ptr__,local_20,1,1);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      local_39 = 1;
    }
    local_38 = (uint)!bVar2;
    if ((local_39 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    pNVar1 = local_20;
    if (local_38 == 0) {
      if ((this->ndArrayInterpretation & 1U) != 0) {
        local_3a = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Crop",&local_61);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,pNVar1,&local_60,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_3a = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_3a & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        pNVar1 = local_20;
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
        local_62 = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Crop",&local_89);
        validateRankCount(__return_storage_ptr__,pNVar1,&local_88,3,-1,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator(&local_89);
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_62 = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_62 & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
        iVar3 = Specification::NeuralNetworkLayer::input_size(local_20);
        if (1 < iVar3) {
          psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_(local_20,0);
          local_98._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find(&this->blobNameToRank,psVar4);
          local_a0._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::end(&this->blobNameToRank);
          bVar2 = std::operator!=(&local_98,&local_a0);
          local_2c2 = false;
          if (bVar2) {
            psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_(local_20,1);
            local_a8._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find(&this->blobNameToRank,psVar4);
            err.field_2._8_8_ =
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::end(&this->blobNameToRank);
            local_2c2 = std::operator!=(&local_a8,(_Self *)((long)&err.field_2 + 8));
          }
          if (local_2c2 != false) {
            psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_(local_20,0);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::at(&this->blobNameToRank,psVar4);
            iVar3 = *pmVar5;
            psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_(local_20,1);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::at(&this->blobNameToRank,psVar4);
            if (iVar3 != *pmVar5) {
              std::__cxx11::string::string((string *)local_d0);
              psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
              std::__cxx11::string::string
                        ((string *)(err_1.field_2._M_local_buf + 8),(string *)psVar4);
              std::operator+(&local_110,"Layer \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&err_1.field_2 + 8));
              std::operator+(&local_f0,&local_110,
                             "\' of type \'Crop\' expects equal ranks for its inputs, but they are not equal."
                            );
              std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
              std::__cxx11::string::~string((string *)&local_f0);
              std::__cxx11::string::~string((string *)&local_110);
              std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_d0);
              local_38 = 1;
              std::__cxx11::string::~string((string *)local_d0);
              return __return_storage_ptr__;
            }
          }
        }
      }
      iVar3 = Specification::NeuralNetworkLayer::input_size(local_20);
      if (iVar3 == 1) {
        pCVar6 = Specification::NeuralNetworkLayer::crop(local_20);
        pBVar7 = Specification::CropLayerParams::cropamounts(pCVar6);
        iVar3 = Specification::BorderAmounts::borderamounts_size(pBVar7);
        if (iVar3 != 2) {
          psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
          std::operator+(&local_1b0,"cropAmounts parameter for the crop layer \'",psVar4);
          std::operator+(&local_190,&local_1b0,"\' is of length ");
          pCVar6 = Specification::NeuralNetworkLayer::crop(local_20);
          pBVar7 = Specification::CropLayerParams::cropamounts(pCVar6);
          iVar3 = Specification::BorderAmounts::borderamounts_size(pBVar7);
          std::__cxx11::to_string((string *)((long)&err_2.field_2 + 8),iVar3);
          std::operator+(&local_170,&local_190,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&err_2.field_2 + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_150,&local_170,
                         " but requires exactly two crop constraints (for X,Y axes).");
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)(err_2.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_1b0);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_150);
          local_38 = 1;
          std::__cxx11::string::~string((string *)local_150);
          return __return_storage_ptr__;
        }
      }
      else {
        pCVar6 = Specification::NeuralNetworkLayer::crop(local_20);
        iVar3 = Specification::CropLayerParams::offset_size(pCVar6);
        if (iVar3 != 2) {
          psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
          std::operator+(&local_250,"Offset parameter for the crop layer \'",psVar4);
          std::operator+(&local_230,&local_250,"\' is of length ");
          pCVar6 = Specification::NeuralNetworkLayer::crop(local_20);
          iVar3 = Specification::CropLayerParams::offset_size(pCVar6);
          std::__cxx11::to_string(&local_270,iVar3);
          std::operator+(&local_210,&local_230,&local_270);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f0,&local_210," but requires exactly two offsets (for X,Y axes).");
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::~string((string *)&local_250);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1f0);
          local_38 = 1;
          std::__cxx11::string::~string((string *)local_1f0);
          return __return_storage_ptr__;
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCropLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Crop", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Crop", 3, -1, blobNameToRank));

        if (layer.input_size() > 1) {
            if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
                blobNameToRank.find(layer.input(1)) != blobNameToRank.end()) {
                if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.input(1))) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Crop' expects equal ranks for its inputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    if (layer.input_size() == 1) {
        // check the border amounts
        if (layer.crop().cropamounts().borderamounts_size() != 2) {
            std::string err = "cropAmounts parameter for the crop layer '" + layer.name() + "' is of length " + std::to_string(layer.crop().cropamounts().borderamounts_size()) + " but requires exactly two crop constraints (for X,Y axes).";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    else { // size == 2 checked above
        // offset must be size 2
        if (layer.crop().offset_size() != 2)  {
            std::string err = "Offset parameter for the crop layer '" + layer.name() + "' is of length " + std::to_string(layer.crop().offset_size()) + " but requires exactly two offsets (for X,Y axes).";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    return Result();
}